

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O3

bool cmGetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name_00;
  bool bVar1;
  cmExecutionStatus *status_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  cmState *pcVar6;
  cmPropertyDefinition *pcVar7;
  char *pcVar8;
  ulong uVar9;
  byte bVar10;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string *psVar12;
  byte bVar13;
  ulong uVar14;
  int iVar15;
  string_view value;
  string_view value_00;
  string_view value_01;
  string output;
  string propertyName;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  ScopeType local_16c;
  OutType local_168;
  cmAlphaNum local_150;
  string local_120;
  string local_100;
  cmExecutionStatus *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_68 [16];
  pointer local_58;
  
  name_00 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)name_00) < 0x41) {
    local_150.View_._M_len = (size_t)local_150.Digits_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((char *)local_150.View_._M_len != local_150.Digits_) {
      operator_delete((void *)local_150.View_._M_len,
                      CONCAT71(local_150.Digits_._1_7_,local_150.Digits_[0]) + 1);
    }
    return false;
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168 = OutValue;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = std::__cxx11::string::compare((char *)(name_00 + 1));
  local_e0 = status;
  if (iVar3 == 0) {
    local_16c = GLOBAL;
LAB_003798d3:
    bVar2 = false;
LAB_003798dc:
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_d0 = 0;
    local_d8 = 0;
    if (0x40 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11)) {
      iVar3 = 1;
      local_168 = OutValue;
      local_d8 = 0;
      local_d0 = 0;
      uVar9 = 2;
      uVar14 = 3;
      do {
        iVar4 = std::__cxx11::string::compare((char *)(pbVar11 + uVar9));
        if (iVar4 == 0) {
          iVar3 = 2;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar9));
          iVar15 = 0;
          if (iVar4 == 0) {
            local_168 = OutBriefDoc;
            iVar3 = iVar15;
          }
          else {
            iVar4 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar9));
            if (iVar4 == 0) {
              local_168 = OutFullDoc;
              iVar3 = iVar15;
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar9));
              if (iVar4 == 0) {
                local_168 = OutSet;
                iVar3 = iVar15;
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar9));
                if (iVar4 == 0) {
                  local_168 = OutDefined;
                  iVar3 = iVar15;
                }
                else {
                  psVar12 = &local_100;
                  if (iVar3 == 1) {
LAB_00379abc:
                    std::__cxx11::string::_M_assign((string *)psVar12);
                    iVar3 = 0;
                  }
                  else if (iVar3 == 0 && bVar2) {
                    uVar5 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar9))
                    ;
                    if ((int)uVar5 == 0) {
                      local_d8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                      iVar3 = 4;
                    }
                    else {
                      uVar5 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + uVar9
                                                 ));
                      if ((int)uVar5 != 0) {
LAB_00379db8:
                        local_150.View_._M_len = 0x18;
                        local_150.View_._M_str = "given invalid argument \"";
                        pbVar11 = (args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start;
                        local_68._8_8_ = pbVar11[uVar9]._M_dataplus._M_p;
                        local_68._0_8_ = pbVar11[uVar9]._M_string_length;
                        cmStrCat<char[3]>(&local_c8,&local_150,(cmAlphaNum *)local_68,
                                          (char (*) [3])0x75454c);
                        std::__cxx11::string::_M_assign((string *)&local_e0->Error);
                        goto LAB_00379e25;
                      }
                      local_d0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                      iVar3 = 5;
                    }
                  }
                  else {
                    psVar12 = &local_120;
                    if (iVar3 == 2) goto LAB_00379abc;
                    this = &local_88;
                    if (iVar3 != 4) {
                      if (iVar3 != 5) goto LAB_00379db8;
                      this = &local_a8;
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back(this,(args->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar9);
                    iVar3 = 0;
                  }
                }
              }
            }
          }
        }
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        bVar1 = uVar14 < (ulong)((long)(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11
                                >> 5);
        uVar9 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar1);
    }
    status_00 = local_e0;
    if (local_120._M_string_length != 0) {
      local_68._0_8_ = (pointer)0x0;
      local_68._8_8_ = (pointer)0x0;
      local_58 = (pointer)0x0;
      bVar13 = (byte)local_d8;
      bVar10 = (byte)local_d0;
      bVar2 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                        (local_e0,(bool)(bVar13 & 1),(bool)(bVar10 & 1),&local_88,&local_a8,
                         (vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_68);
      if (bVar2) {
        if (local_168 == OutDefined) {
          pcVar6 = cmMakefile::GetState(status_00->Makefile);
          pcVar7 = cmState::GetPropertyDefinition(pcVar6,&local_120,local_16c);
          pcVar8 = "1";
          if (pcVar7 == (cmPropertyDefinition *)0x0) {
            pcVar8 = "0";
          }
          bVar2 = true;
          value_01._M_str = pcVar8;
          value_01._M_len = 1;
          cmMakefile::AddDefinition(status_00->Makefile,name_00,value_01);
        }
        else {
          if (local_168 == OutFullDoc) {
            local_150.View_._M_len = (size_t)local_150.Digits_;
            local_150.View_._M_str = (char *)0x0;
            local_150.Digits_[0] = '\0';
            pcVar6 = cmMakefile::GetState(status_00->Makefile);
            pcVar7 = cmState::GetPropertyDefinition(pcVar6,&local_120,local_16c);
            if (pcVar7 != (cmPropertyDefinition *)0x0) {
              std::__cxx11::string::_M_assign((string *)&local_150);
            }
            if (local_150.View_._M_str == (char *)0x0) {
              std::__cxx11::string::operator=((string *)&local_150,"NOTFOUND");
            }
            value_00._M_str = (char *)local_150.View_._M_len;
            value_00._M_len = (size_t)local_150.View_._M_str;
            cmMakefile::AddDefinition(status_00->Makefile,name_00,value_00);
          }
          else {
            if (local_168 != OutBriefDoc) {
              bVar2 = true;
              switch(local_16c) {
              case TARGET:
                bVar2 = anon_unknown.dwarf_1269c02::HandleTargetMode
                                  (status_00,&local_100,local_168,name_00,&local_120);
                break;
              case SOURCE_FILE:
                bVar2 = anon_unknown.dwarf_1269c02::HandleSourceMode
                                  (status_00,&local_100,local_168,name_00,&local_120,
                                   *(cmMakefile **)local_68._0_8_,(bool)((bVar10 | bVar13) & 1));
                break;
              case DIRECTORY:
                bVar2 = anon_unknown.dwarf_1269c02::HandleDirectoryMode
                                  (status_00,&local_100,local_168,name_00,&local_120);
                break;
              case GLOBAL:
                bVar2 = anon_unknown.dwarf_1269c02::HandleGlobalMode
                                  (status_00,(string *)local_100._M_string_length,local_168,name_00,
                                   &local_120);
                break;
              case CACHE:
                bVar2 = anon_unknown.dwarf_1269c02::HandleCacheMode
                                  (status_00,&local_100,local_168,name_00,&local_120);
                break;
              case TEST:
                bVar2 = anon_unknown.dwarf_1269c02::HandleTestMode
                                  (status_00,&local_100,local_168,name_00,&local_120);
                break;
              case VARIABLE:
                bVar2 = anon_unknown.dwarf_1269c02::HandleVariableMode
                                  (status_00,(string *)local_100._M_string_length,local_168,name_00,
                                   &local_120);
                break;
              case INSTALL:
                bVar2 = anon_unknown.dwarf_1269c02::HandleInstallMode
                                  (status_00,&local_100,local_168,name_00,&local_120);
              }
              goto switchD_00379d6e_caseD_7;
            }
            local_150.View_._M_len = (size_t)local_150.Digits_;
            local_150.View_._M_str = (char *)0x0;
            local_150.Digits_[0] = '\0';
            pcVar6 = cmMakefile::GetState(status_00->Makefile);
            pcVar7 = cmState::GetPropertyDefinition(pcVar6,&local_120,local_16c);
            if (pcVar7 != (cmPropertyDefinition *)0x0) {
              std::__cxx11::string::_M_assign((string *)&local_150);
            }
            if (local_150.View_._M_str == (char *)0x0) {
              std::__cxx11::string::operator=((string *)&local_150,"NOTFOUND");
            }
            value._M_str = (char *)local_150.View_._M_len;
            value._M_len = (size_t)local_150.View_._M_str;
            cmMakefile::AddDefinition(status_00->Makefile,name_00,value);
          }
          if ((char *)local_150.View_._M_len != local_150.Digits_) {
            operator_delete((void *)local_150.View_._M_len,
                            CONCAT71(local_150.Digits_._1_7_,local_150.Digits_[0]) + 1);
          }
          bVar2 = true;
        }
      }
      else {
        bVar2 = false;
      }
switchD_00379d6e_caseD_7:
      if ((pointer)local_68._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
      }
      goto LAB_00379f5f;
    }
    local_150.View_._M_len = (size_t)local_150.Digits_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"not given a PROPERTY <name> argument.","");
    std::__cxx11::string::_M_assign((string *)&local_e0->Error);
    if ((char *)local_150.View_._M_len != local_150.Digits_) {
      local_c8.field_2._M_allocated_capacity =
           CONCAT71(local_150.Digits_._1_7_,local_150.Digits_[0]);
      local_c8._M_dataplus._M_p = (pointer)local_150.View_._M_len;
LAB_00379c3e:
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 == 0) {
      local_16c = DIRECTORY;
      goto LAB_003798d3;
    }
    local_16c = TARGET;
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 == 0) goto LAB_003798d3;
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 == 0) {
      local_16c = SOURCE_FILE;
      bVar2 = true;
      goto LAB_003798dc;
    }
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 == 0) {
      local_16c = TEST;
      goto LAB_003798d3;
    }
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 == 0) {
      local_16c = VARIABLE;
      goto LAB_003798d3;
    }
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 == 0) {
      local_16c = CACHE;
      goto LAB_003798d3;
    }
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar3 == 0) {
      local_16c = INSTALL;
      goto LAB_003798d3;
    }
    local_150.View_._M_len = (size_t)&DAT_00000014;
    local_150.View_._M_str = "given invalid scope ";
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_68._8_8_ = pbVar11[1]._M_dataplus._M_p;
    local_68._0_8_ = pbVar11[1]._M_string_length;
    cmStrCat<char[87]>(&local_c8,&local_150,(cmAlphaNum *)local_68,
                       (char (*) [87])
                       ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."
                      );
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00379e25:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) goto LAB_00379c3e;
  }
  bVar2 = false;
LAB_00379f5f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool cmGetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  OutType infoType = OutValue;
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  std::string name;
  std::string propertyName;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  // Get the scope from which to get the property.
  cmProperty::ScopeType scope;
  if (args[1] == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (args[1] == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (args[1] == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (args[1] == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (args[1] == "TEST") {
    scope = cmProperty::TEST;
  } else if (args[1] == "VARIABLE") {
    scope = cmProperty::VARIABLE;
  } else if (args[1] == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (args[1] == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat(
      "given invalid scope ", args[1],
      ".  "
      "Valid scopes are "
      "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."));
    return false;
  }

  // Parse remaining arguments.
  enum Doing
  {
    DoingNone,
    DoingName,
    DoingProperty,
    DoingType,
    DoingSourceDirectory,
    DoingSourceTargetDirectory
  };
  Doing doing = DoingName;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "PROPERTY") {
      doing = DoingProperty;
    } else if (args[i] == "BRIEF_DOCS") {
      doing = DoingNone;
      infoType = OutBriefDoc;
    } else if (args[i] == "FULL_DOCS") {
      doing = DoingNone;
      infoType = OutFullDoc;
    } else if (args[i] == "SET") {
      doing = DoingNone;
      infoType = OutSet;
    } else if (args[i] == "DEFINED") {
      doing = DoingNone;
      infoType = OutDefined;
    } else if (doing == DoingName) {
      doing = DoingNone;
      name = args[i];
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingProperty) {
      doing = DoingNone;
      propertyName = args[i];
    } else {
      status.SetError(cmStrCat("given invalid argument \"", args[i], "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }

  // Compute requested output.
  if (infoType == OutBriefDoc) {
    // Lookup brief documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetShortDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutFullDoc) {
    // Lookup full documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetFullDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutDefined) {
    // Lookup if the property is defined
    if (status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                               scope)) {
      status.GetMakefile().AddDefinition(variable, "1");
    } else {
      status.GetMakefile().AddDefinition(variable, "0");
    }
  } else {
    // Dispatch property getting.
    cmMakefile& directory_scope_mf = *(source_file_directory_makefiles[0]);
    bool source_file_paths_should_be_absolute =
      source_file_directory_option_enabled ||
      source_file_target_option_enabled;

    switch (scope) {
      case cmProperty::GLOBAL:
        return HandleGlobalMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::DIRECTORY:
        return HandleDirectoryMode(status, name, infoType, variable,
                                   propertyName);
      case cmProperty::TARGET:
        return HandleTargetMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::SOURCE_FILE:
        return HandleSourceMode(status, name, infoType, variable, propertyName,
                                directory_scope_mf,
                                source_file_paths_should_be_absolute);
      case cmProperty::TEST:
        return HandleTestMode(status, name, infoType, variable, propertyName);
      case cmProperty::VARIABLE:
        return HandleVariableMode(status, name, infoType, variable,
                                  propertyName);
      case cmProperty::CACHE:
        return HandleCacheMode(status, name, infoType, variable, propertyName);
      case cmProperty::INSTALL:
        return HandleInstallMode(status, name, infoType, variable,
                                 propertyName);

      case cmProperty::CACHED_VARIABLE:
        break; // should never happen
    }
  }

  return true;
}